

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TeamCityOutputTest_TestNameEscaped_Ignore_TestShell::createTest
          (TEST_TeamCityOutputTest_TestNameEscaped_Ignore_TestShell *this)

{
  TEST_TeamCityOutputTest_TestNameEscaped_Ignore_Test *this_00;
  TEST_TeamCityOutputTest_TestNameEscaped_Ignore_TestShell *this_local;
  
  this_00 = (TEST_TeamCityOutputTest_TestNameEscaped_Ignore_Test *)
            operator_new(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                         ,0xcb);
  TEST_TeamCityOutputTest_TestNameEscaped_Ignore_Test::
  TEST_TeamCityOutputTest_TestNameEscaped_Ignore_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TeamCityOutputTest, TestNameEscaped_Ignore)
{
	IgnoredUtestShell itst("group", "'[]\n\r", "file", 10);
	result->currentTestStarted(&itst);
	const char* expected =
		"##teamcity[testStarted name='|'|[|]|n|r']\n"
		"##teamcity[testIgnored name='|'|[|]|n|r']\n";
	STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}